

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O0

spv_result_t
spvTextToBinaryWithOptions
          (spv_const_context context,char *input_text,size_t input_text_size,uint32_t options,
          spv_binary *pBinary,spv_diagnostic *pDiagnostic)

{
  spv_result_t sVar1;
  undefined1 local_a8 [4];
  spv_result_t result;
  AssemblyGrammar grammar;
  spv_text_t text;
  spv_context_t hijack_context;
  spv_diagnostic *pDiagnostic_local;
  spv_binary *pBinary_local;
  uint32_t options_local;
  size_t input_text_size_local;
  char *input_text_local;
  spv_const_context context_local;
  
  hijack_context.consumer._M_invoker = (_Invoker_type)pDiagnostic;
  spv_context_t::spv_context_t((spv_context_t *)&text.length,context);
  if (hijack_context.consumer._M_invoker != (_Invoker_type)0x0) {
    *(undefined8 *)hijack_context.consumer._M_invoker = 0;
    spvtools::UseDiagnosticAsMessageConsumer
              ((spv_context)&text.length,(spv_diagnostic *)hijack_context.consumer._M_invoker);
  }
  grammar.extInstTable_ = (spv_ext_inst_table)input_text;
  text.str = (char *)input_text_size;
  spvtools::AssemblyGrammar::AssemblyGrammar
            ((AssemblyGrammar *)local_a8,(spv_const_context)&text.length);
  sVar1 = anon_unknown.dwarf_222cc27::spvTextToBinaryInternal
                    ((AssemblyGrammar *)local_a8,(MessageConsumer *)&hijack_context.ext_inst_table,
                     (spv_text)&grammar.extInstTable_,options,pBinary);
  if ((hijack_context.consumer._M_invoker != (_Invoker_type)0x0) &&
     (*(long *)hijack_context.consumer._M_invoker != 0)) {
    *(undefined1 *)(*(long *)hijack_context.consumer._M_invoker + 0x20) = 1;
  }
  spv_context_t::~spv_context_t((spv_context_t *)&text.length);
  return sVar1;
}

Assistant:

spv_result_t spvTextToBinaryWithOptions(const spv_const_context context,
                                        const char* input_text,
                                        const size_t input_text_size,
                                        const uint32_t options,
                                        spv_binary* pBinary,
                                        spv_diagnostic* pDiagnostic) {
  spv_context_t hijack_context = *context;
  if (pDiagnostic) {
    *pDiagnostic = nullptr;
    spvtools::UseDiagnosticAsMessageConsumer(&hijack_context, pDiagnostic);
  }

  spv_text_t text = {input_text, input_text_size};
  spvtools::AssemblyGrammar grammar(&hijack_context);

  spv_result_t result = spvTextToBinaryInternal(
      grammar, hijack_context.consumer, &text, options, pBinary);
  if (pDiagnostic && *pDiagnostic) (*pDiagnostic)->isTextSource = true;

  return result;
}